

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaPtr xmlSchemaNewSchema(xmlSchemaParserCtxtPtr ctxt)

{
  xmlDictPtr dict;
  xmlSchemaPtr __s;
  
  __s = (xmlSchemaPtr)(*xmlMalloc)(0xa0);
  if (__s == (xmlSchemaPtr)0x0) {
    xmlSchemaPErrMemory(ctxt);
  }
  else {
    memset(__s,0,0xa0);
    dict = ctxt->dict;
    __s->dict = dict;
    xmlDictReference(dict);
  }
  return __s;
}

Assistant:

static xmlSchemaPtr
xmlSchemaNewSchema(xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaPtr ret;

    ret = (xmlSchemaPtr) xmlMalloc(sizeof(xmlSchema));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchema));
    ret->dict = ctxt->dict;
    xmlDictReference(ret->dict);

    return (ret);
}